

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O3

NamespaceDeclaration * __thiscall
QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
          (QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this)

{
  qsizetype *pqVar1;
  long lVar2;
  NamespaceDeclaration *__ptr;
  long lVar3;
  long lVar4;
  
  __ptr = this->data;
  lVar3 = this->tos + 1;
  lVar2 = this->cap;
  if (lVar2 <= lVar3) {
    lVar4 = this->tos + 2;
    lVar3 = lVar2 * 2;
    if (lVar4 != lVar3 && SBORROW8(lVar4,lVar3) == lVar4 + lVar2 * -2 < 0) {
      lVar3 = lVar4;
    }
    this->cap = lVar3;
    __ptr = (NamespaceDeclaration *)realloc(__ptr,lVar3 * 0x30);
    this->data = __ptr;
    if (__ptr == (NamespaceDeclaration *)0x0) {
      qBadAlloc();
    }
    lVar3 = this->tos + 1;
  }
  this->tos = lVar3;
  pqVar1 = &__ptr[lVar3].namespaceUri.m_pos;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pqVar1 = &__ptr[lVar3].prefix.m_size;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  __ptr[lVar3].prefix.m_string = (QString *)0x0;
  __ptr[lVar3].prefix.m_pos = 0;
  return __ptr + lVar3;
}

Assistant:

inline T &rawPush() {  return *new (data + (++tos)) T; }